

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O3

string * google::protobuf::compiler::php::anon_unknown_2::FilenameToClassname
                   (string *__return_storage_ptr__,string *filename)

{
  pointer pcVar1;
  string *psVar2;
  string *psVar3;
  
  std::__cxx11::string::find_last_of((char *)filename,0x434dd2,0xffffffffffffffff);
  std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)filename);
  psVar2 = (string *)__return_storage_ptr__->_M_string_length;
  if (psVar2 != (string *)0x0) {
    psVar3 = (string *)0x0;
    do {
      pcVar1 = (__return_storage_ptr__->_M_dataplus)._M_p;
      if (pcVar1[(long)&(psVar3->_M_dataplus)._M_p] == '/') {
        pcVar1[(long)&(psVar3->_M_dataplus)._M_p] = '\\';
        psVar2 = (string *)__return_storage_ptr__->_M_string_length;
      }
      psVar3 = (string *)((long)&(psVar3->_M_dataplus)._M_p + 1);
    } while (psVar3 < psVar2);
  }
  return psVar2;
}

Assistant:

std::string FilenameToClassname(const std::string& filename) {
  int lastindex = filename.find_last_of(".");
  std::string result = filename.substr(0, lastindex);
  for (int i = 0; i < result.size(); i++) {
    if (result[i] == '/') {
      result[i] = '\\';
    }
  }
  return result;
}